

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit-customdata.cc
# Opt level: O0

void customdata_test(void)

{
  bool bVar1;
  int local_330;
  allocator local_329;
  int ival;
  allocator local_301;
  string local_300;
  undefined1 local_2e0 [8];
  string retval_str;
  string local_2b8;
  undefined1 local_298 [8];
  MetaVariable metavar2;
  string local_258;
  allocator local_231;
  string local_230;
  allocator local_209;
  string local_208;
  double local_1e8;
  double retval;
  string local_1d8;
  byte local_1b1;
  undefined1 local_1b0 [7];
  bool ret;
  MetaVariable metavar;
  string local_170;
  allocator local_149;
  string local_148;
  undefined1 local_128 [8];
  CustomDataType customData;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [8];
  MetaVariable stringVal;
  int local_84;
  undefined1 local_80 [8];
  MetaVariable intVal;
  undefined1 local_40 [8];
  MetaVariable doubleVal;
  
  intVal._name.field_2._8_8_ = 0x4008000000000000;
  tinyusdz::MetaVariable::MetaVariable<double>
            ((MetaVariable *)local_40,(double *)((long)&intVal._name.field_2 + 8));
  local_84 = 9;
  tinyusdz::MetaVariable::MetaVariable<int>((MetaVariable *)local_80,&local_84);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_f0,"dora",
             (allocator *)((long)&customData._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  tinyusdz::MetaVariable::MetaVariable<std::__cxx11::string>((MetaVariable *)local_d0,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&customData._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
         *)local_128);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_148,"hello:myval",&local_149);
  bVar1 = tinyusdz::SetCustomDataByKey
                    (&local_148,(MetaVariable *)local_40,(CustomDataType *)local_128);
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-customdata.cc"
                 ,0x1e,"%s","tinyusdz::SetCustomDataByKey(\"hello:myval\", doubleVal, customData)");
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_170,"hello:myval",
             (allocator *)(metavar._name.field_2._M_local_buf + 0xf));
  bVar1 = tinyusdz::HasCustomDataKey((CustomDataType *)local_128,&local_170);
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-customdata.cc"
                 ,0x20,"%s","tinyusdz::HasCustomDataKey(customData, \"hello:myval\")");
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator((allocator<char> *)(metavar._name.field_2._M_local_buf + 0xf));
  tinyusdz::MetaVariable::MetaVariable((MetaVariable *)local_1b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d8,"hello:myval",(allocator *)((long)&retval + 7));
  bVar1 = tinyusdz::GetCustomDataByKey
                    ((CustomDataType *)local_128,&local_1d8,(MetaVariable *)local_1b0);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&retval + 7));
  local_1b1 = bVar1;
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-customdata.cc"
                 ,0x25,"%s","ret == true");
  local_1e8 = 0.0;
  tinyusdz::MetaVariable::get_value<double>((MetaVariable *)local_1b0,&local_1e8);
  acutest_check_(-(uint)(local_1e8 == 3.0) & 1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-customdata.cc"
                 ,0x2a,"%s","retval == 3.0");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_208,"hello:myval2",&local_209);
  bVar1 = tinyusdz::SetCustomDataByKey
                    (&local_208,(MetaVariable *)local_d0,(CustomDataType *)local_128);
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-customdata.cc"
                 ,0x2d,"%s","tinyusdz::SetCustomDataByKey(\"hello:myval2\", stringVal, customData)")
  ;
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_230,"hello:myval",&local_231);
  bVar1 = tinyusdz::HasCustomDataKey((CustomDataType *)local_128,&local_230);
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-customdata.cc"
                 ,0x2f,"%s","tinyusdz::HasCustomDataKey(customData, \"hello:myval\")");
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_258,"hello:myval2",
             (allocator *)(metavar2._name.field_2._M_local_buf + 0xf));
  bVar1 = tinyusdz::HasCustomDataKey((CustomDataType *)local_128,&local_258);
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-customdata.cc"
                 ,0x30,"%s","tinyusdz::HasCustomDataKey(customData, \"hello:myval2\")");
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator((allocator<char> *)(metavar2._name.field_2._M_local_buf + 0xf));
  tinyusdz::MetaVariable::MetaVariable((MetaVariable *)local_298);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2b8,"hello:myval2",
             (allocator *)(retval_str.field_2._M_local_buf + 0xf));
  local_1b1 = tinyusdz::GetCustomDataByKey
                        ((CustomDataType *)local_128,&local_2b8,(MetaVariable *)local_298);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)(retval_str.field_2._M_local_buf + 0xf));
  acutest_check_(local_1b1 & 1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-customdata.cc"
                 ,0x35,"%s","ret == true");
  std::__cxx11::string::string((string *)local_2e0);
  tinyusdz::MetaVariable::get_value<std::__cxx11::string>
            ((MetaVariable *)local_298,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_2e0,"dora");
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-customdata.cc"
                 ,0x3a,"%s","retval_str == \"dora\"");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_300,"hello:myval",&local_301);
  bVar1 = tinyusdz::SetCustomDataByKey
                    (&local_300,(MetaVariable *)local_80,(CustomDataType *)local_128);
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-customdata.cc"
                 ,0x3e,"%s","tinyusdz::SetCustomDataByKey(\"hello:myval\", intVal, customData)");
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&ival,"hello:myval",&local_329);
  local_1b1 = tinyusdz::GetCustomDataByKey
                        ((CustomDataType *)local_128,(string *)&ival,(MetaVariable *)local_1b0);
  std::__cxx11::string::~string((string *)&ival);
  std::allocator<char>::~allocator((allocator<char> *)&local_329);
  acutest_check_(local_1b1 & 1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-customdata.cc"
                 ,0x40,"%s","ret == true");
  local_330 = 0;
  tinyusdz::MetaVariable::get_value<int>((MetaVariable *)local_1b0,&local_330);
  acutest_check_((uint)(local_330 == 9),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-customdata.cc"
                 ,0x45,"%s","ival == 9");
  std::__cxx11::string::~string((string *)local_2e0);
  tinyusdz::MetaVariable::~MetaVariable((MetaVariable *)local_298);
  tinyusdz::MetaVariable::~MetaVariable((MetaVariable *)local_1b0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
          *)local_128);
  tinyusdz::MetaVariable::~MetaVariable((MetaVariable *)local_d0);
  tinyusdz::MetaVariable::~MetaVariable((MetaVariable *)local_80);
  tinyusdz::MetaVariable::~MetaVariable((MetaVariable *)local_40);
  return;
}

Assistant:

void customdata_test(void) {

  MetaVariable doubleVal = double(3.0);
  MetaVariable intVal = int(9);
  MetaVariable stringVal = std::string("dora");

  CustomDataType customData;

  //
  // customData = {
  //    dictionary hello = {
  //      double myval = 3.0
  //    }
  // } 

  // Namespace ':' to create nested dictionary data.
  TEST_CHECK(tinyusdz::SetCustomDataByKey("hello:myval", doubleVal, customData));

  TEST_CHECK(tinyusdz::HasCustomDataKey(customData, "hello:myval"));

  MetaVariable metavar;
  bool ret = tinyusdz::GetCustomDataByKey(customData, "hello:myval", &metavar);

  TEST_CHECK(ret == true);

  double retval{0.0};
  metavar.get_value<double>(&retval);

  TEST_CHECK(retval == 3.0);

  // Add another key
  TEST_CHECK(tinyusdz::SetCustomDataByKey("hello:myval2", stringVal, customData));

  TEST_CHECK(tinyusdz::HasCustomDataKey(customData, "hello:myval"));
  TEST_CHECK(tinyusdz::HasCustomDataKey(customData, "hello:myval2"));

  MetaVariable metavar2;
  ret = tinyusdz::GetCustomDataByKey(customData, "hello:myval2", &metavar2);

  TEST_CHECK(ret == true);

  std::string retval_str;
  metavar2.get_value<std::string>(&retval_str);

  TEST_CHECK(retval_str == "dora");

  // override
  {
    TEST_CHECK(tinyusdz::SetCustomDataByKey("hello:myval", intVal, customData));
    ret = tinyusdz::GetCustomDataByKey(customData, "hello:myval", &metavar);
    TEST_CHECK(ret == true);

    int ival{0};
    metavar.get_value<int>(&ival);

    TEST_CHECK(ival == 9);
  }
}